

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *__s_00;
  char *pcVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  string *__range2;
  size_type sVar8;
  char cVar9;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  string format;
  string s;
  FilePath local_138;
  allocator<char> local_111;
  FilePath local_110;
  FilePath local_f0;
  FilePath local_d0;
  FilePath local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,FLAGS_gtest_output_abi_cxx11_,
             DAT_00153700 + FLAGS_gtest_output_abi_cxx11_);
  __s_00 = local_50[0];
  GetOutputFormat_abi_cxx11_();
  if (local_68 == 0) {
    paVar1 = &local_110.pathname_.field_2;
    local_110.pathname_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"xml","");
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.pathname_._M_dataplus._M_p,
                      local_110.pathname_.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar5 = strchr((char *)__s_00,0x3a);
  if (pcVar5 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_90);
    paVar1 = &local_138.pathname_.field_2;
    local_138.pathname_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_f0.pathname_._M_dataplus._M_p,
               local_f0.pathname_._M_dataplus._M_p + local_f0.pathname_._M_string_length);
    _Var7._M_p = local_138.pathname_._M_dataplus._M_p;
    if (local_138.pathname_._M_string_length != 0) {
      sVar8 = 0;
      do {
        cVar9 = local_138.pathname_._M_dataplus._M_p[sVar8];
        if (((cVar9 != '/') || (cVar9 = '/', _Var7._M_p == local_138.pathname_._M_dataplus._M_p)) ||
           (_Var7._M_p[-1] != '/')) {
          *_Var7._M_p = cVar9;
          _Var7._M_p = _Var7._M_p + 1;
        }
        sVar8 = sVar8 + 1;
      } while (local_138.pathname_._M_string_length != sVar8);
    }
    local_138.pathname_._M_string_length =
         (long)_Var7._M_p - (long)local_138.pathname_._M_dataplus._M_p;
    *_Var7._M_p = '\0';
    paVar3 = &local_b0.pathname_.field_2;
    local_b0.pathname_._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"test_detail","");
    paVar2 = &local_d0.pathname_.field_2;
    local_d0.pathname_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0.pathname_._M_dataplus._M_p,
               local_b0.pathname_._M_dataplus._M_p + local_b0.pathname_._M_string_length);
    _Var7._M_p = local_d0.pathname_._M_dataplus._M_p;
    if (local_d0.pathname_._M_string_length != 0) {
      sVar8 = 0;
      do {
        cVar9 = local_d0.pathname_._M_dataplus._M_p[sVar8];
        if (((cVar9 != '/') || (cVar9 = '/', _Var7._M_p == local_d0.pathname_._M_dataplus._M_p)) ||
           (_Var7._M_p[-1] != '/')) {
          *_Var7._M_p = cVar9;
          _Var7._M_p = _Var7._M_p + 1;
        }
        sVar8 = sVar8 + 1;
      } while (local_d0.pathname_._M_string_length != sVar8);
    }
    local_d0.pathname_._M_string_length =
         (long)_Var7._M_p - (long)local_d0.pathname_._M_dataplus._M_p;
    *_Var7._M_p = '\0';
    FilePath::MakeFileName(&local_110,&local_138,&local_d0,0,(char *)local_70);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.pathname_._M_dataplus._M_p != &local_110.pathname_.field_2) {
      operator_delete(local_110.pathname_._M_dataplus._M_p,
                      local_110.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.pathname_._M_dataplus._M_p,
                      local_d0.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.pathname_._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0.pathname_._M_dataplus._M_p,
                      local_b0.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_138.pathname_._M_dataplus._M_p,
                      local_138.pathname_.field_2._M_allocated_capacity + 1);
    }
    _Var7._M_p = local_f0.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.pathname_._M_dataplus._M_p == &local_f0.pathname_.field_2) goto LAB_00119f82;
  }
  else {
    __s = pcVar5 + 1;
    paVar1 = &local_138.pathname_.field_2;
    local_138.pathname_._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,__s,pcVar5 + sVar6 + 1);
    paVar2 = &local_110.pathname_.field_2;
    local_110.pathname_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_138.pathname_._M_dataplus._M_p,
               local_138.pathname_._M_dataplus._M_p + local_138.pathname_._M_string_length);
    _Var7._M_p = local_110.pathname_._M_dataplus._M_p;
    if (local_110.pathname_._M_string_length != 0) {
      sVar8 = 0;
      do {
        cVar9 = local_110.pathname_._M_dataplus._M_p[sVar8];
        if (((cVar9 != '/') || (cVar9 = '/', _Var7._M_p == local_110.pathname_._M_dataplus._M_p)) ||
           (_Var7._M_p[-1] != '/')) {
          *_Var7._M_p = cVar9;
          _Var7._M_p = _Var7._M_p + 1;
        }
        sVar8 = sVar8 + 1;
      } while (local_110.pathname_._M_string_length != sVar8);
    }
    local_110.pathname_._M_string_length =
         (long)_Var7._M_p - (long)local_110.pathname_._M_dataplus._M_p;
    *_Var7._M_p = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_138.pathname_._M_dataplus._M_p,
                      local_138.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (*local_110.pathname_._M_dataplus._M_p != '/') {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_111);
      paVar3 = &local_f0.pathname_.field_2;
      local_f0.pathname_._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_d0.pathname_._M_dataplus._M_p,
                 local_d0.pathname_._M_dataplus._M_p + local_d0.pathname_._M_string_length);
      _Var7._M_p = local_f0.pathname_._M_dataplus._M_p;
      if (local_f0.pathname_._M_string_length != 0) {
        sVar8 = 0;
        do {
          cVar9 = local_f0.pathname_._M_dataplus._M_p[sVar8];
          if (((cVar9 != '/') || (cVar9 = '/', _Var7._M_p == local_f0.pathname_._M_dataplus._M_p))
             || (_Var7._M_p[-1] != '/')) {
            *_Var7._M_p = cVar9;
            _Var7._M_p = _Var7._M_p + 1;
          }
          sVar8 = sVar8 + 1;
        } while (local_f0.pathname_._M_string_length != sVar8);
      }
      local_f0.pathname_._M_string_length =
           (long)_Var7._M_p - (long)local_f0.pathname_._M_dataplus._M_p;
      *_Var7._M_p = '\0';
      local_90 = local_80;
      sVar6 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar6);
      paVar4 = &local_b0.pathname_.field_2;
      local_b0.pathname_._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_90,local_88 + (long)local_90);
      _Var7._M_p = local_b0.pathname_._M_dataplus._M_p;
      if (local_b0.pathname_._M_string_length != 0) {
        sVar8 = 0;
        do {
          cVar9 = local_b0.pathname_._M_dataplus._M_p[sVar8];
          if (((cVar9 != '/') || (cVar9 = '/', _Var7._M_p == local_b0.pathname_._M_dataplus._M_p))
             || (_Var7._M_p[-1] != '/')) {
            *_Var7._M_p = cVar9;
            _Var7._M_p = _Var7._M_p + 1;
          }
          sVar8 = sVar8 + 1;
        } while (local_b0.pathname_._M_string_length != sVar8);
      }
      local_b0.pathname_._M_string_length =
           (long)_Var7._M_p - (long)local_b0.pathname_._M_dataplus._M_p;
      *_Var7._M_p = '\0';
      FilePath::ConcatPaths(&local_138,&local_f0,&local_b0);
      std::__cxx11::string::_M_assign((string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.pathname_._M_dataplus._M_p != paVar1) {
        operator_delete(local_138.pathname_._M_dataplus._M_p,
                        local_138.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.pathname_._M_dataplus._M_p != paVar4) {
        operator_delete(local_b0.pathname_._M_dataplus._M_p,
                        local_b0.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.pathname_._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0.pathname_._M_dataplus._M_p,
                        local_f0.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.pathname_._M_dataplus._M_p != &local_d0.pathname_.field_2) {
        operator_delete(local_d0.pathname_._M_dataplus._M_p,
                        local_d0.pathname_.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_110.pathname_._M_string_length == 0) ||
       (local_110.pathname_._M_dataplus._M_p[local_110.pathname_._M_string_length - 1] != '/')) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                (&local_138,&local_110,&local_f0,local_d0.pathname_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.pathname_._M_dataplus._M_p != &local_d0.pathname_.field_2) {
        operator_delete(local_d0.pathname_._M_dataplus._M_p,
                        local_d0.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.pathname_._M_dataplus._M_p != &local_f0.pathname_.field_2) {
        operator_delete(local_f0.pathname_._M_dataplus._M_p,
                        local_f0.pathname_.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.pathname_._M_dataplus._M_p != paVar1) {
        operator_delete(local_138.pathname_._M_dataplus._M_p,
                        local_138.pathname_.field_2._M_allocated_capacity + 1);
      }
    }
    local_f0.pathname_.field_2._M_allocated_capacity =
         local_110.pathname_.field_2._M_allocated_capacity;
    _Var7._M_p = local_110.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.pathname_._M_dataplus._M_p == paVar2) goto LAB_00119f82;
  }
  operator_delete(_Var7._M_p,local_f0.pathname_.field_2._M_allocated_capacity + 1);
LAB_00119f82:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}